

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
* __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::type_name(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
            *this)

{
  value_t vVar1;
  type_data_t *in_RSI;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d;
  allocator local_1c;
  allocator local_1b;
  allocator local_1a;
  allocator local_19 [9];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
  *this_local;
  
  this_local = this;
  vVar1 = nlohmann::basic_json::type_data_t::operator_cast_to_value_t(in_RSI);
  switch(vVar1) {
  case null:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"null",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
    break;
  case object:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"object",&local_1a);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a);
    break;
  case array:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"array",&local_1b);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b);
    break;
  case string:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"string",&local_1c);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c);
    break;
  case boolean:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"boolean",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"number",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case discarded:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"discarded",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  return this;
}

Assistant:

string_t type_name() const noexcept
        {
            switch (m_type)
            {
                case value_t::null:
                    return "null";
                case value_t::object:
                    return "object";
                case value_t::array:
                    return "array";
                case value_t::string:
                    return "string";
                case value_t::boolean:
                    return "boolean";
                case value_t::discarded:
                    return "discarded";
                default:
                    return "number";
            }
        }